

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double f_pdf(double x,int m,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double __x;
  double __x_00;
  
  dVar3 = 0.0;
  if (0.0 <= x) {
    __x = (double)m;
    __x_00 = (double)n;
    dVar1 = pow(__x,__x);
    dVar2 = pow(__x_00,__x_00);
    dVar3 = pow(x,(double)(m + -2));
    dVar3 = dVar3 * dVar2 * dVar1;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar1 = r8_beta(__x * 0.5,__x_00 * 0.5);
    dVar2 = pow(x * __x + __x_00,(double)(n + m));
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = dVar3 / (dVar1 * dVar2);
  }
  return dVar3;
}

Assistant:

double f_pdf ( double x, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_PDF evaluates the F central PDF.
//
//  Discussion:
//
//    PDF(M,N;X) = M^(M/2) * X^((M-2)/2)
//      / ( Beta(M/2,N/2) * N^(M/2) * ( 1 + (M/N) * X )^((M+N)/2)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, double F_PDF, the value of the PDF.
//
{
  double a;
  double b;
  double bot1;
  double bot2;
  double pdf;
  double top;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    a = static_cast<double>(m );
    b = static_cast<double>(n );

    top = sqrt ( pow ( a, m ) * pow ( b, n ) * pow ( x, m - 2 ) );
    bot1 = r8_beta ( a / 2.0, b / 2.0 ) ;
    bot2 = sqrt ( pow ( b + a * x, m + n ) );

    pdf = top / ( bot1 * bot2 );
  }

  return pdf;
}